

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O1

int fec_decode(fec_t *fec,gf *pkts,uint *idxs,uint len)

{
  gf c;
  uint uVar1;
  long lVar2;
  size_t __n;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  gf *b;
  gf *a;
  ulong uVar8;
  ulong uVar9;
  undefined8 uStack_70;
  gf agStack_68 [8];
  gf *local_60;
  size_t local_58;
  gf *local_50;
  uint local_44;
  gf *local_40;
  uint *local_38;
  
  if (fec == (fec_t *)0x0) {
    uStack_70 = 0x107155;
    __assert_fail("fec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0xcd,
                  "int fec_decode(fec_t *, gf *, unsigned int *, unsigned int)");
  }
  uVar6 = fec->k;
  if (uVar6 != 0) {
    uVar3 = 0;
    do {
      uVar1 = idxs[uVar3];
      if (uVar1 < uVar6 && uVar1 != uVar3) {
        if (idxs[uVar1] == uVar1) {
          return 0;
        }
        idxs[uVar3] = idxs[uVar1];
        idxs[uVar1] = uVar1;
      }
      else {
        uVar3 = uVar3 + 1;
      }
      uVar6 = fec->k;
    } while (uVar3 < uVar6);
  }
  lVar2 = -((ulong)(fec->k * fec->k) + 0xf & 0xfffffffffffffff0);
  local_38 = idxs;
  *(undefined8 *)((long)&uStack_70 + lVar2) = 0x107059;
  iVar4 = fec_decode_matrix(fec,agStack_68 + lVar2,idxs);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    uVar5 = (ulong)fec->k;
    iVar4 = 1;
    if (fec->k != 0) {
      local_58 = (size_t)len;
      uVar9 = 0;
      puVar7 = local_38;
      local_60 = agStack_68 + lVar2;
      local_50 = agStack_68;
      local_44 = len;
      local_40 = pkts;
      do {
        __n = local_58;
        if ((uint)uVar5 <= puVar7[uVar9]) {
          a = local_40 + (int)uVar9 * len;
          *(undefined8 *)((long)&uStack_70 + lVar2) = 0x1070ba;
          memset(a,0,__n);
          uVar5 = (ulong)fec->k;
          puVar7 = local_38;
          if (fec->k != 0) {
            uVar8 = 0;
            do {
              b = local_40 + local_38[uVar8] * len;
              c = local_60[(uint)((int)uVar5 * (int)uVar9 + (int)uVar8)];
              *(undefined8 *)((long)&uStack_70 + lVar2) = 0x1070f3;
              gf_add_mul(a,b,c,len);
              uVar8 = uVar8 + 1;
              uVar5 = (ulong)fec->k;
              puVar7 = local_38;
            } while (uVar8 < uVar5);
          }
        }
        uVar9 = uVar9 + 1;
        uVar5 = (ulong)fec->k;
      } while (uVar9 < uVar5);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int fec_decode(fec_t *fec,
               gf *pkts,
               unsigned int idxs[], unsigned len) {
  assert(fec != NULL);
  
  if (!fec_shuffle(fec, idxs))
    return 0;

  /*M
    Build decoding matrix.
  **/
  gf dec_matrix[fec->k * fec->k];
  if (!fec_decode_matrix(fec, dec_matrix, idxs))
    return 0;

  unsigned int row;
  for (row = 0; row < fec->k; row++) {
    if (idxs[row] >= fec->k) {
      gf *pkt = pkts + row * len;
      
      bzero(pkt, len * sizeof(gf));
      unsigned int col;
      for (col = 0; col < fec->k; col++) {
        gf_add_mul(pkt, pkts + idxs[col] * len,
                   dec_matrix[row * fec->k + col], len);
      }
    }
  }

  return 1;
}